

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::CoverageNameOrHierFunc::checkArguments
          (CoverageNameOrHierFunc *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg_00;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  reference ppEVar3;
  Symbol *pSVar4;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  ASTContext *in_RDI;
  size_t in_R9;
  string_view sVar5;
  Type *type;
  Symbol *sym;
  Expression *arg;
  Compilation *comp;
  SourceLocation SVar6;
  DiagCode code;
  Scope *in_stack_ffffffffffffff58;
  Diagnostic *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Diagnostic *in_stack_ffffffffffffff70;
  Args *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 isMethod;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SystemSubroutine *in_stack_ffffffffffffff98;
  SourceLocation in_stack_ffffffffffffffa0;
  SourceLocation in_stack_ffffffffffffffa8;
  
  isMethod = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0xaede21);
  code = SUB84((ulong)in_RDI[1].randomizeDetails >> 0x20,0);
  SVar6 = in_RDX;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::size
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (in_RDI + 1));
  callRange.endLoc = in_stack_ffffffffffffffa8;
  callRange.startLoc = in_stack_ffffffffffffffa0;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_ffffffffffffff98,
                     (ASTContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (bool)isMethod,in_stack_ffffffffffffff80,callRange,(size_t)this_00,in_R9);
  if (!bVar1) {
    pTVar2 = Compilation::getErrorType(this_00);
    return pTVar2;
  }
  ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,
                       (ulong)*(uint *)&in_RDI[1].firstTempVar);
  if ((*ppEVar3)->kind == ArbitrarySymbol) {
    Expression::as<slang::ast::ArbitrarySymbolExpression>(*ppEVar3);
    pSVar4 = not_null<const_slang::ast::Symbol_*>::operator*
                       ((not_null<const_slang::ast::Symbol_*> *)0xaedf18);
    bVar1 = Symbol::isValue((Symbol *)0xaedf2d);
    if (bVar1) {
      Symbol::as<slang::ast::ValueSymbol>((Symbol *)0xaedf43);
      ValueSymbol::getType((ValueSymbol *)0xaedf4b);
      bVar1 = Type::isString((Type *)0xaedf60);
      if (!bVar1) {
        sourceRange.endLoc = SVar6;
        sourceRange.startLoc = in_RSI;
        ASTContext::addDiag(in_RDI,code,sourceRange);
        ast::operator<<(in_stack_ffffffffffffff70,
                        (Type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        sVar5 = SystemSubroutine::kindStr((SystemSubroutine *)0xaedfc6);
        arg_00._M_len._4_4_ = in_stack_ffffffffffffff6c;
        arg_00._M_len._0_4_ = in_stack_ffffffffffffff68;
        arg_00._M_str = (char *)sVar5._M_len;
        Diagnostic::operator<<(in_stack_ffffffffffffff60,arg_00);
        pTVar2 = Compilation::getErrorType(this_00);
        return pTVar2;
      }
    }
    else if (pSVar4->kind != Root) {
      if (pSVar4->kind == Instance) {
        Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0xaee02e);
        bVar1 = InstanceSymbol::isModule((InstanceSymbol *)0xaee036);
        if (bVar1) goto LAB_00aee0ad;
      }
      not_null<const_slang::ast::Scope_*>::operator->
                ((not_null<const_slang::ast::Scope_*> *)0xaee047);
      bVar1 = Scope::isUninstantiated(in_stack_ffffffffffffff58);
      if (!bVar1) {
        sourceRange_00.endLoc = SVar6;
        sourceRange_00.startLoc = in_RSI;
        ASTContext::addDiag(in_RDI,code,sourceRange_00);
      }
      pTVar2 = Compilation::getErrorType(this_00);
      return pTVar2;
    }
  }
LAB_00aee0ad:
  return (Type *)in_RDI[1].instanceOrProc;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, requiredArgs, argTypes.size()))
            return comp.getErrorType();

        auto arg = args[nameOrHierIndex];
        if (arg->kind == ExpressionKind::ArbitrarySymbol) {
            auto& sym = *arg->as<ArbitrarySymbolExpression>().symbol;
            if (sym.isValue()) {
                auto& type = sym.as<ValueSymbol>().getType();
                if (!type.isString()) {
                    context.addDiag(diag::BadSystemSubroutineArg, arg->sourceRange)
                        << type << kindStr();
                    return comp.getErrorType();
                }
            }
            else if (sym.kind != SymbolKind::Root &&
                     (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedModuleInstance, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return *returnType;
    }